

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<QList<QBenchmarkResult>_>::reallocateAndGrow
          (QArrayDataPointer<QList<QBenchmarkResult>_> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QList<QBenchmarkResult>_> *old)

{
  Data *pDVar1;
  Data *pDVar2;
  QBenchmarkResult *pQVar3;
  qsizetype qVar4;
  QList<QBenchmarkResult> *pQVar5;
  undefined1 *puVar6;
  QList<QBenchmarkResult> *data;
  long lVar7;
  QList<QBenchmarkResult> *pQVar8;
  long in_FS_OFFSET;
  QArrayDataPointer<QList<QBenchmarkResult>_> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((old == (QArrayDataPointer<QList<QBenchmarkResult>_> *)0x0 && where == GrowsAtEnd) &&
       (pDVar1 = this->d, pDVar1 != (Data *)0x0)) && (0 < n)) &&
     ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      QtPrivate::QMovableArrayOps<QList<QBenchmarkResult>_>::reallocate
                ((QMovableArrayOps<QList<QBenchmarkResult>_> *)this,
                 n + this->size +
                 ((long)((long)this->ptr -
                        ((ulong)((long)&pDVar1[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
                        ) >> 3) * -0x5555555555555555,Grow);
      return;
    }
  }
  else {
    local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.ptr = (QList<QBenchmarkResult> *)&DAT_aaaaaaaaaaaaaaaa;
    allocateGrow(&local_48,this,n,where);
    if (local_48.ptr == (QList<QBenchmarkResult> *)0x0 && 0 < n) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        qBadAlloc();
      }
    }
    else {
      if (this->size != 0) {
        lVar7 = this->size + (n >> 0x3f & n);
        if (((this->d == (Data *)0x0) || (old != (QArrayDataPointer<QList<QBenchmarkResult>_> *)0x0)
            ) || (1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
          if (0 < lVar7) {
            pQVar8 = this->ptr;
            pQVar5 = pQVar8 + lVar7;
            do {
              pDVar2 = (pQVar8->d).d;
              local_48.ptr[local_48.size].d.d = pDVar2;
              local_48.ptr[local_48.size].d.ptr = (pQVar8->d).ptr;
              local_48.ptr[local_48.size].d.size = (pQVar8->d).size;
              if (pDVar2 != (Data *)0x0) {
                LOCK();
                (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
                UNLOCK();
              }
              pQVar8 = pQVar8 + 1;
              local_48.size = local_48.size + 1;
            } while (pQVar8 < pQVar5);
          }
        }
        else if (0 < lVar7) {
          pQVar8 = this->ptr;
          pQVar5 = pQVar8 + lVar7;
          do {
            pDVar2 = (pQVar8->d).d;
            (pQVar8->d).d = (Data *)0x0;
            local_48.ptr[local_48.size].d.d = pDVar2;
            pQVar3 = (pQVar8->d).ptr;
            (pQVar8->d).ptr = (QBenchmarkResult *)0x0;
            local_48.ptr[local_48.size].d.ptr = pQVar3;
            qVar4 = (pQVar8->d).size;
            (pQVar8->d).size = 0;
            local_48.ptr[local_48.size].d.size = qVar4;
            pQVar8 = pQVar8 + 1;
            local_48.size = local_48.size + 1;
          } while (pQVar8 < pQVar5);
        }
      }
      pDVar1 = this->d;
      pQVar5 = this->ptr;
      this->d = local_48.d;
      this->ptr = local_48.ptr;
      puVar6 = (undefined1 *)this->size;
      this->size = local_48.size;
      local_48.d = pDVar1;
      local_48.ptr = pQVar5;
      local_48.size = (qsizetype)puVar6;
      if (old != (QArrayDataPointer<QList<QBenchmarkResult>_> *)0x0) {
        local_48.d = old->d;
        local_48.ptr = old->ptr;
        old->d = pDVar1;
        old->ptr = pQVar5;
        local_48.size = old->size;
        old->size = (qsizetype)puVar6;
      }
      ~QArrayDataPointer(&local_48);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        return;
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }